

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,ChunkHeader *header)

{
  bool bVar1;
  value_type_conflict4 vVar2;
  value_type_conflict3 vVar3;
  reference pMVar4;
  MaskRect MVar5;
  value_type_conflict4 *in_RSI;
  istream *in_RDI;
  MaskRect *tmask;
  iterator __end1_1;
  iterator __begin1_1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1_1;
  MaskRect *mask;
  iterator __end1;
  iterator __begin1;
  vector<MaskRect,_std::allocator<MaskRect>_> *__range1;
  ChunkHeaderRaw h;
  MaskRectRaw *this;
  istream *in_stack_ffffffffffffff70;
  __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> *__lhs;
  size_type in_stack_ffffffffffffff88;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_ffffffffffffff90;
  __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> local_68;
  value_type_conflict4 *local_60;
  MaskRectRaw local_58;
  MaskRect local_50;
  reference local_48;
  MaskRect *local_40;
  __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> local_38;
  value_type_conflict4 *local_30;
  value_type_conflict4 *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<ChunkHeaderRaw>(in_stack_ffffffffffffff70);
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x116273);
  *local_10 = vVar2;
  this = (MaskRectRaw *)(local_10 + 4);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::value
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)0x11629f);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __lhs = (__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_> *)
          (local_10 + 0x10);
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::value
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)0x1162cc);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x1162e9);
  local_10[0x1c] = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x116306);
  local_10[0x1d] = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x116323);
  local_10[0x1e] = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x116340);
  local_10[0x1f] = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x11635d);
  local_10[0x20] = vVar2;
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x11637a);
  *(value_type_conflict3 *)(local_10 + 0x22) = vVar3;
  local_30 = local_10 + 4;
  local_38._M_current =
       (MaskRect *)
       std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
                 ((vector<MaskRect,_std::allocator<MaskRect>_> *)this);
  local_40 = (MaskRect *)
             std::vector<MaskRect,_std::allocator<MaskRect>_>::end
                       ((vector<MaskRect,_std::allocator<MaskRect>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                              *)this);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
               operator*(&local_38);
    local_58 = readRaw<MaskRectRaw>((istream *)this);
    local_50 = MaskRectRaw::operator_cast_to_MaskRect(this);
    *local_48 = local_50;
    __gnu_cxx::__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++(&local_38);
  }
  local_60 = local_10 + 0x10;
  local_68._M_current =
       (MaskRect *)
       std::vector<MaskRect,_std::allocator<MaskRect>_>::begin
                 ((vector<MaskRect,_std::allocator<MaskRect>_> *)this);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::end
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>
                              *)this);
    if (!bVar1) break;
    pMVar4 = __gnu_cxx::
             __normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
             operator*(&local_68);
    readRaw<MaskRectRaw>((istream *)this);
    MVar5 = MaskRectRaw::operator_cast_to_MaskRect(this);
    *pMVar4 = MVar5;
    __gnu_cxx::__normal_iterator<MaskRect_*,_std::vector<MaskRect,_std::allocator<MaskRect>_>_>::
    operator++(&local_68);
  }
  std::istream::ignore((long)local_8);
  return local_8;
}

Assistant:

std::istream& operator>>(std::istream& stream, ChunkHeader& header) {
	auto h = readRaw<ChunkHeaderRaw>(stream);
	header.type = static_cast<ChunkHeader::Type>(h.type.value());
	header.masks.resize(h.masks.value());
	header.transparentMasks.resize(h.transparentMasks.value());
	header.alignmentWords = h.alignmentWords.value();
	header.x = h.x.value();
	header.y = h.y.value();
	header.w = h.w.value();
	header.h = h.h.value();
	header.size = h.size.value();
	for (auto& mask : header.masks) {
		mask = readRaw<MaskRectRaw>(stream);
	}
	for (auto& tmask : header.transparentMasks) {
		tmask = readRaw<MaskRectRaw>(stream);
	}
	stream.ignore(header.alignmentWords * 2);
	return stream;
}